

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O0

void a__appProcessXButton(XEvent *e)

{
  ATimeUs AVar1;
  int iVar2;
  int iVar3;
  uint local_24;
  uint pressed;
  uint buttons_changed_bits;
  int dy;
  int dx;
  ATimeUs timestamp;
  uint button;
  XEvent *e_local;
  
  dx = 0;
  AVar1 = aAppTime();
  switch((e->xkey).keycode) {
  case 1:
    dx = 1;
    break;
  case 2:
    dx = 4;
    break;
  case 3:
    dx = 2;
    break;
  case 4:
    dx = 8;
    break;
  case 5:
    dx = 0x10;
  }
  if (e->type == 4) {
    local_24 = a__app_state.pointer.buttons ^ dx;
  }
  else {
    local_24 = a__app_state.pointer.buttons & dx;
  }
  a__app_state.pointer.buttons = local_24 ^ a__app_state.pointer.buttons;
  iVar2 = (e->xkey).x - a__app_state.pointer.x;
  iVar3 = (e->xkey).y - a__app_state.pointer.y;
  a__app_state.pointer.x = (e->xkey).x;
  a__app_state.pointer.y = (e->xkey).y;
  if (a__app_proctable.pointer != (_func_void_ATimeUs_int_int_uint *)0x0) {
    (*a__app_proctable.pointer)(AVar1,iVar2,iVar3,local_24);
  }
  return;
}

Assistant:

static void a__appProcessXButton(const XEvent *e) {
	unsigned int button = 0;
	ATimeUs timestamp = aAppTime();
	int dx, dy;
	unsigned int buttons_changed_bits;
	const unsigned int pressed = e->xbutton.type == ButtonPress;

	switch (e->xbutton.button) {
	case Button1: button = AB_Left; break;
	case Button2: button = AB_Middle; break;
	case Button3: button = AB_Right; break;
	case Button4: button = AB_WheelUp; break;
	case Button5: button = AB_WheelDown; break;
	}

	if (pressed)
		buttons_changed_bits = a__app_state.pointer.buttons ^ button;
	else
		buttons_changed_bits = a__app_state.pointer.buttons & button;

	a__app_state.pointer.buttons ^= buttons_changed_bits;

	dx = e->xbutton.x - a__app_state.pointer.x;
	dy = e->xbutton.y - a__app_state.pointer.y;
	a__app_state.pointer.x = e->xbutton.x;
	a__app_state.pointer.y = e->xbutton.y;

	if (a__app_proctable.pointer)
		a__app_proctable.pointer(timestamp, dx, dy, buttons_changed_bits);
}